

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

void tplt_linedir(FILE *out,int lineno,char *filename)

{
  char *local_20;
  char *filename_local;
  int lineno_local;
  FILE *out_local;
  
  fprintf((FILE *)out,"#line %d \"",(ulong)(uint)lineno);
  for (local_20 = filename; *local_20 != '\0'; local_20 = local_20 + 1) {
    if (*local_20 == '\\') {
      putc(0x5c,(FILE *)out);
    }
    putc((int)*local_20,(FILE *)out);
  }
  fprintf((FILE *)out,"\"\n");
  return;
}

Assistant:

PRIVATE void tplt_linedir(FILE *out, int lineno, char *filename)
{
  fprintf(out,"#line %d \"",lineno);
  while( *filename ){
    if( *filename == '\\' ) putc('\\',out);
    putc(*filename,out);
    filename++;
  }
  fprintf(out,"\"\n");
}